

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  conv_layer_t *this;
  layer_t *this_00;
  pool_layer_t *this_01;
  fc_layer_t *this_02;
  long lVar2;
  long lVar3;
  allocator local_cd;
  float local_cc;
  vector<layer_t_*,_std::allocator<layer_t_*>_> layers;
  vector<case_t,_std::allocator<case_t>_> cases;
  tensor_t<float> image_tensor;
  _Vector_base<layer_t_*,_std::allocator<layer_t_*>_> local_68;
  string local_50;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Reading test cases.");
  std::endl<char,std::char_traits<char>>(poVar1);
  readTrainingData();
  layers.super__Vector_base<layer_t_*,_std::allocator<layer_t_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  layers.super__Vector_base<layer_t_*,_std::allocator<layer_t_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  layers.super__Vector_base<layer_t_*,_std::allocator<layer_t_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  poVar1 = std::operator<<((ostream *)&std::cout,"Creating layers.");
  std::endl<char,std::char_traits<char>>(poVar1);
  this = (conv_layer_t *)operator_new(0xb0);
  conv_layer_t::conv_layer_t
            (this,1,5,8,
             ((cases.super__Vector_base<case_t,_std::allocator<case_t>_>._M_impl.
               super__Vector_impl_data._M_start)->data).size);
  this_00 = (layer_t *)operator_new(0x7c);
  relu_layer_t::relu_layer_t((relu_layer_t *)this_00,(this->super_layer_t).out.size);
  this_01 = (pool_layer_t *)operator_new(0x80);
  pool_layer_t::pool_layer_t(this_01,2,2,(this_00->out).size);
  this_02 = (fc_layer_t *)operator_new(0xd4);
  fc_layer_t::fc_layer_t(this_02,(this_01->super_layer_t).out.size,10);
  image_tensor.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)this;
  std::vector<layer_t*,std::allocator<layer_t*>>::emplace_back<layer_t*>
            ((vector<layer_t*,std::allocator<layer_t*>> *)&layers,(layer_t **)&image_tensor);
  image_tensor.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)this_00;
  std::vector<layer_t*,std::allocator<layer_t*>>::emplace_back<layer_t*>
            ((vector<layer_t*,std::allocator<layer_t*>> *)&layers,(layer_t **)&image_tensor);
  image_tensor.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)this_01;
  std::vector<layer_t*,std::allocator<layer_t*>>::emplace_back<layer_t*>
            ((vector<layer_t*,std::allocator<layer_t*>> *)&layers,(layer_t **)&image_tensor);
  image_tensor.data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)this_02;
  std::vector<layer_t*,std::allocator<layer_t*>>::emplace_back<layer_t*>
            ((vector<layer_t*,std::allocator<layer_t*>> *)&layers,(layer_t **)&image_tensor);
  lVar2 = std::chrono::_V2::system_clock::now();
  local_cc = trainCNN(&layers,&cases);
  lVar3 = std::chrono::_V2::system_clock::now();
  std::operator<<((ostream *)&std::cout,"Training completed.\n");
  std::operator<<((ostream *)&std::cout,"  Time (baseline): ");
  poVar1 = std::ostream::_M_insert<double>((double)(lVar3 - lVar2) * 1e-09);
  std::operator<<(poVar1," s.\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"  Total error: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_cc);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::string((string *)&local_50,"../test.ppm",&local_cd);
  loadImageAsTensor(&image_tensor,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  forward(&layers,&image_tensor);
  std::vector<layer_t_*,_std::allocator<layer_t_*>_>::vector
            ((vector<layer_t_*,_std::allocator<layer_t_*>_> *)&local_68,&layers);
  printResult((vector<layer_t_*,_std::allocator<layer_t_*>_> *)&local_68);
  std::_Vector_base<layer_t_*,_std::allocator<layer_t_*>_>::~_Vector_base(&local_68);
  conv_layer_t::~conv_layer_t(this);
  operator_delete(this);
  layer_t::~layer_t(this_00);
  operator_delete(this_00);
  layer_t::~layer_t((layer_t *)this_01);
  operator_delete(this_01);
  fc_layer_t::~fc_layer_t(this_02);
  operator_delete(this_02);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            ((_Vector_base<float,_std::allocator<float>_> *)&image_tensor);
  std::_Vector_base<layer_t_*,_std::allocator<layer_t_*>_>::~_Vector_base
            (&layers.super__Vector_base<layer_t_*,_std::allocator<layer_t_*>_>);
  std::vector<case_t,_std::allocator<case_t>_>::~vector(&cases);
  return 0;
}

Assistant:

int main() {
  Timer t;

  /* Training phase */
  std::cout << "Reading test cases." << std::endl;
  std::vector<case_t> cases = readTrainingData();

  std::vector<layer_t *> layers;

  // The following layers make up the CNN in sequence.
  std::cout << "Creating layers." << std::endl;
  auto layer1 = new conv_layer_t(1, 5, 8, cases[0].data.size);
  auto layer2 = new relu_layer_t(layer1->out.size);
  auto layer3 = new pool_layer_t(2, 2, layer2->out.size);
  auto layer4 = new fc_layer_t(layer3->out.size, 10);

  // Push the layers into a vector of layers.
  layers.push_back(layer1);
  layers.push_back(layer2);
  layers.push_back(layer3);
  layers.push_back(layer4);

  // Train the CNN
  t.start();
  auto total_error = trainCNN(layers, cases);
  t.stop();
  std::cout << "Training completed.\n";
  std::cout << "  Time (baseline): " << t.seconds() << " s.\n";
  std::cout << "  Total error: " << total_error << std::endl;

  /* Test inference */
  // Load the test image
  auto image_tensor = loadImageAsTensor("../test.ppm");

  // Infer the CNN with the result image
  forward(layers, image_tensor);

  printResult(layers);

  delete layer1;
  delete layer2;
  delete layer3;
  delete layer4;

  return 0;

}